

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_schemes.c
# Opt level: O1

char * nni_http_stream_scheme(char *upper)

{
  long lVar1;
  int iVar2;
  long lVar3;
  anon_struct_16_2_be9ba488 *paVar4;
  
  iVar2 = strcmp("http",upper);
  if (iVar2 == 0) {
    paVar4 = http_schemes;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0xc0) {
        return (char *)0x0;
      }
      iVar2 = strcmp(*(char **)((long)&http_schemes[1].upper + lVar3),upper);
      lVar1 = lVar3 + 0x10;
    } while (iVar2 != 0);
    paVar4 = (anon_struct_16_2_be9ba488 *)(lVar3 + 0x1568e0);
  }
  return paVar4->lower;
}

Assistant:

const char *
nni_http_stream_scheme(const char *upper)
{
	for (int i = 0; http_schemes[i].upper != NULL; i++) {
		if (strcmp(http_schemes[i].upper, upper) == 0) {
			return (http_schemes[i].lower);
		}
	}
	return (NULL);
}